

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OnDiskIndex.cpp
# Opt level: O1

uint64_t find_max_batch(vector<IndexMergeHelper,_std::allocator<IndexMergeHelper>_> *indexes,
                       uint32_t trigram,uint64_t max_bytes)

{
  pointer puVar1;
  vector<IndexMergeHelper,_std::allocator<IndexMergeHelper>_> *pvVar2;
  IndexMergeHelper *ndx;
  pointer pIVar3;
  vector<IndexMergeHelper,_std::allocator<IndexMergeHelper>_> *pvVar4;
  const_iterator __end2;
  long lVar5;
  ulong uVar6;
  bool bVar7;
  bool bVar8;
  
  bVar7 = trigram - 0xffffff < 0xff000000;
  pvVar4 = indexes;
  if (!bVar7) {
    lVar5 = 1;
    do {
      uVar6 = 0;
      for (pIVar3 = (indexes->
                    super__Vector_base<IndexMergeHelper,_std::allocator<IndexMergeHelper>_>)._M_impl
                    .super__Vector_impl_data._M_start;
          pIVar3 != (indexes->
                    super__Vector_base<IndexMergeHelper,_std::allocator<IndexMergeHelper>_>)._M_impl
                    .super__Vector_impl_data._M_finish; pIVar3 = pIVar3 + 1) {
        puVar1 = (pIVar3->run_offset_cache).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start + trigram;
        uVar6 = (uVar6 - *puVar1) + puVar1[lVar5];
      }
      pvVar4 = (vector<IndexMergeHelper,_std::allocator<IndexMergeHelper>_> *)(lVar5 - 1);
      if (max_bytes < uVar6) break;
      lVar5 = lVar5 + 1;
      bVar8 = (int)lVar5 + trigram < 0x1000000;
      bVar7 = !bVar8;
      pvVar4 = indexes;
    } while (bVar8);
  }
  pvVar2 = (vector<IndexMergeHelper,_std::allocator<IndexMergeHelper>_> *)
           (ulong)(0x1000000 - trigram);
  if (!bVar7) {
    pvVar2 = pvVar4;
  }
  return (uint64_t)pvVar2;
}

Assistant:

uint64_t find_max_batch(const std::vector<IndexMergeHelper> &indexes,
                        uint32_t trigram, uint64_t max_bytes) {
    for (int i = 1; trigram + i < NUM_TRIGRAMS; i++) {
        uint64_t batch_bytes = 0;
        for (const auto &ndx : indexes) {
            batch_bytes += ndx.run(trigram, i).size();
        }
        if (batch_bytes > max_bytes) {
            return i - 1;
        }
    }
    return NUM_TRIGRAMS - trigram;
}